

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBatchInsert::GetGlobalSinkState(PhysicalBatchInsert *this,ClientContext *context)

{
  Catalog *this_00;
  CatalogTransaction transaction;
  SchemaCatalogEntry *pSVar1;
  type info;
  TableCatalogEntry *this_01;
  ColumnList *pCVar2;
  DuckTableEntry *args_1;
  ClientContext *in_RDX;
  optional_ptr<duckdb::CatalogEntry,_true> created_table;
  idx_t minimum_memory_per_thread;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_70;
  _func_int **local_68;
  unsigned_long local_60;
  CatalogTransaction local_58;
  
  if ((context->config).system_progress_bar_disable_reason == (char *)0x0) {
    local_70.ptr = (TableCatalogEntry *)(context->config).profiler_settings._M_h._M_buckets;
  }
  else {
    pSVar1 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
                        &(context->config).emit_profiler_output);
    this_00 = (pSVar1->super_InCatalogEntry).catalog;
    Catalog::GetCatalogTransaction(&local_58,this_00,in_RDX);
    pSVar1 = *(SchemaCatalogEntry **)&(context->config).emit_profiler_output;
    info = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)&(context->config).system_progress_bar_disable_reason);
    transaction.context.ptr = local_58.context.ptr;
    transaction.db.ptr = local_58.db.ptr;
    transaction.transaction.ptr = local_58.transaction.ptr;
    transaction.transaction_id = local_58.transaction_id;
    transaction.start_time = local_58.start_time;
    local_70.ptr = (TableCatalogEntry *)Catalog::CreateTable(this_00,transaction,pSVar1,info);
    local_70.ptr = (TableCatalogEntry *)
                   optional_ptr<duckdb::CatalogEntry,_true>::operator->
                             ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_70);
  }
  this_01 = optional_ptr<duckdb::TableCatalogEntry,_true>::operator->(&local_70);
  pCVar2 = TableCatalogEntry::GetColumns(this_01);
  local_60 = ((long)(pCVar2->physical_columns).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pCVar2->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x80000;
  args_1 = (DuckTableEntry *)optional_ptr<duckdb::TableCatalogEntry,_true>::operator->(&local_70);
  make_uniq<duckdb::BatchInsertGlobalState,duckdb::ClientContext&,duckdb::DuckTableEntry&,unsigned_long&>
            ((duckdb *)&local_68,in_RDX,args_1,&local_60);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_68;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBatchInsert::GetGlobalSinkState(ClientContext &context) const {
	optional_ptr<TableCatalogEntry> table;
	if (info) {
		// CREATE TABLE AS
		D_ASSERT(!insert_table);
		auto &catalog = schema->catalog;
		auto created_table = catalog.CreateTable(catalog.GetCatalogTransaction(context), *schema.get_mutable(), *info);
		table = &created_table->Cast<TableCatalogEntry>();
	} else {
		D_ASSERT(insert_table);
		D_ASSERT(insert_table->IsDuckTable());
		table = insert_table.get_mutable();
	}
	// heuristic - we start off by allocating 4MB of cache space per column
	static constexpr const idx_t MINIMUM_MEMORY_PER_COLUMN = 4ULL * 1024ULL * 1024ULL;
	auto minimum_memory_per_thread = table->GetColumns().PhysicalColumnCount() * MINIMUM_MEMORY_PER_COLUMN;
	auto result = make_uniq<BatchInsertGlobalState>(context, table->Cast<DuckTableEntry>(), minimum_memory_per_thread);
	return std::move(result);
}